

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O2

int __thiscall FRFFLump::FillCache(FRFFLump *this)

{
  byte *pbVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar4 = FUncompressedLump::FillCache(&this->super_FUncompressedLump);
  if (((this->super_FUncompressedLump).super_FResourceLump.Flags & 8) != 0) {
    uVar2 = (this->super_FUncompressedLump).super_FResourceLump.LumpSize;
    uVar5 = 0x100;
    if ((int)uVar2 < 0x100) {
      uVar5 = uVar2;
    }
    pcVar3 = (this->super_FUncompressedLump).super_FResourceLump.Cache;
    uVar7 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pbVar1 = (byte *)(pcVar3 + uVar7);
      *pbVar1 = *pbVar1 ^ (byte)(uVar7 >> 1);
    }
  }
  return iVar4;
}

Assistant:

int FRFFLump::FillCache()
{
	int res = FUncompressedLump::FillCache();

	if (Flags & LUMPF_BLOODCRYPT)
	{
		int cryptlen = MIN<int> (LumpSize, 256);
		BYTE *data = (BYTE *)Cache;
		
		for (int i = 0; i < cryptlen; ++i)
		{
			data[i] ^= i >> 1;
		}
	}
	return res;
}